

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colors.cpp
# Opt level: O3

bool __thiscall
Colors::outputColorCode::anon_class_1_0_00000001::operator()(anon_class_1_0_00000001 *this)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  
  pcVar2 = getenv("COLORS");
  if ((pcVar2 == (char *)0x0) || (bVar3 = true, *pcVar2 != '1')) {
    iVar1 = isatty(1);
    if (iVar1 == 0) {
      bVar3 = false;
    }
    else {
      pcVar2 = getenv("COLORS");
      if (pcVar2 == (char *)0x0) {
        bVar3 = true;
      }
      else {
        bVar3 = *pcVar2 != '0';
      }
    }
  }
  return bVar3;
}

Assistant:

void Colors::outputColorCode(std::ostream& stream, const char* colorCode) {
  const static bool has_color = []() {
    return (getenv("COLORS") && getenv("COLORS")[0] == '1') || // forced
           (isatty(STDOUT_FILENO) &&
            (!getenv("COLORS") || getenv("COLORS")[0] != '0')); // implicit
  }();
  if (has_color && colors_enabled) {
    stream << colorCode;
  }
}